

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O1

int LS_Sector_SetPlaneReflection
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  sector_t *psVar1;
  uint uVar2;
  FSectorTagIterator local_20;
  
  if (arg0 == 0) {
    local_20.start = 0;
  }
  else {
    local_20.start = tagManager.TagHashFirst[(ulong)(uint)arg0 & 0xff];
  }
  local_20.searchtag = arg0;
  uVar2 = FSectorTagIterator::Next(&local_20);
  if (-1 < (int)uVar2) {
    do {
      psVar1 = sectors;
      if (sectors[uVar2].floorplane.normal.Y == 0.0 && sectors[uVar2].floorplane.normal.X == 0.0) {
        sectors[uVar2].reflect[0] = (float)arg1 * 0.003921569;
      }
      if (psVar1[uVar2].ceilingplane.normal.Y == 0.0 && psVar1[uVar2].ceilingplane.normal.X == 0.0)
      {
        psVar1[uVar2].reflect[1] = (float)arg2 * 0.003921569;
      }
      uVar2 = FSectorTagIterator::Next(&local_20);
    } while (-1 < (int)uVar2);
  }
  return 1;
}

Assistant:

int LS_Sector_SetPlaneReflection (line_t *ln, AActor *it, bool backSide,
	int arg0, int arg1, int arg2, int arg3, int arg4)
{
// Sector_SetPlaneReflection (tag, floor, ceiling)
	int secnum;
	FSectorTagIterator itr(arg0);

	while ((secnum = itr.Next()) >= 0)
	{
		sector_t * s = &sectors[secnum];
		if (!s->floorplane.isSlope()) s->reflect[sector_t::floor] = arg1/255.f;
		if (!s->ceilingplane.isSlope()) sectors[secnum].reflect[sector_t::ceiling] = arg2/255.f;
	}

	return true;
}